

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
          (CodedInputStream *this,uint64 *value)

{
  bool bVar1;
  uint uVar2;
  uint64 *in_RSI;
  CodedInputStream *in_RDI;
  uint8 *ptr;
  uint8 bytes [8];
  int in_stack_ffffffffffffffcc;
  CodedInputStream *in_stack_ffffffffffffffd8;
  uint8 *buffer;
  uint8 local_20 [8];
  uint64 *local_18;
  
  local_18 = in_RSI;
  uVar2 = BufferSize(in_RDI);
  if (uVar2 < 8) {
    bVar1 = ReadRaw(in_stack_ffffffffffffffd8,in_RDI,in_stack_ffffffffffffffcc);
    if (!bVar1) {
      return false;
    }
    buffer = local_20;
  }
  else {
    buffer = in_RDI->buffer_;
    Advance(in_RDI,8);
  }
  ReadLittleEndian64FromArray(buffer,local_18);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian64Fallback(uint64* value) {
  uint8 bytes[sizeof(*value)];

  const uint8* ptr;
  if (BufferSize() >= sizeof(*value)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian64FromArray(ptr, value);
  return true;
}